

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O1

void __thiscall
pbrt::Array2D<pbrt::SPPMPixel>::Array2D
          (Array2D<pbrt::SPPMPixel> *this,Bounds2i *extent,allocator_type allocator)

{
  SPPMPixel *pSVar1;
  Frame *pFVar2;
  Normal3f *pNVar3;
  SampledSpectrum *pSVar4;
  undefined1 auVar6 [12];
  undefined1 auVar5 [64];
  SPPMPixel *pSVar7;
  Tuple2<pbrt::Point2,_int> TVar8;
  int iVar9;
  undefined4 extraout_var;
  long lVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  
  TVar8 = (extent->pMax).super_Tuple2<pbrt::Point2,_int>;
  (this->extent).pMin.super_Tuple2<pbrt::Point2,_int> =
       (extent->pMin).super_Tuple2<pbrt::Point2,_int>;
  (this->extent).pMax.super_Tuple2<pbrt::Point2,_int> = TVar8;
  (this->allocator).memoryResource = allocator.memoryResource;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = (extent->pMax).super_Tuple2<pbrt::Point2,_int>;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = (extent->pMin).super_Tuple2<pbrt::Point2,_int>;
  auVar16 = vpsubd_avx(auVar14,auVar16);
  auVar14 = vpshufd_avx(auVar16,0x55);
  auVar14 = vpmulld_avx(auVar14,auVar16);
  uVar13 = auVar14._0_4_;
  iVar9 = (*(allocator.memoryResource)->_vptr_memory_resource[2])
                    (allocator.memoryResource,(long)(int)uVar13 * 0xa0,8);
  this->values = (SPPMPixel *)CONCAT44(extraout_var,iVar9);
  if (0 < (int)uVar13) {
    lVar10 = 0x78;
    uVar11 = 0;
    auVar15 = ZEXT1664((undefined1  [16])0x0);
    do {
      pSVar7 = this->values;
      auVar5 = vmovdqu64_avx512f(auVar15);
      *(undefined1 (*) [64])
       &pSVar7[uVar11].vp.bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.z = auVar5;
      pSVar1 = pSVar7 + uVar11;
      auVar5 = vmovdqu64_avx512f(auVar15);
      auVar6 = auVar5._4_12_;
      pSVar1->radius = (Float)auVar5._0_4_;
      (pSVar1->Ld).r = (Float)auVar6._0_4_;
      (pSVar1->Ld).g = (Float)auVar6._4_4_;
      (pSVar1->Ld).b = (Float)auVar6._8_4_;
      (pSVar1->vp).p = (Point3f)auVar5._16_12_;
      (pSVar1->vp).wo = (Vector3f)auVar5._28_12_;
      (pSVar1->vp).bsdf.eta = (Float)auVar5._40_4_;
      *(int *)&(pSVar1->vp).bsdf.field_0x4 = auVar5._44_4_;
      (pSVar1->vp).bsdf.bxdf = (BxDFHandle)auVar5._48_8_;
      (pSVar1->vp).bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar5._56_4_;
      (pSVar1->vp).bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar5._60_4_;
      auVar5 = vmovdqu64_avx512f(auVar15);
      *(undefined1 (*) [64])&pSVar7[uVar11].vp.bsdf.ng.super_Tuple3<pbrt::Normal3,_float>.y = auVar5
      ;
      pFVar2 = &pSVar7[uVar11].vp.bsdf.shadingFrame;
      (pFVar2->x).super_Tuple3<pbrt::Vector3,_float>.x = 1.0;
      (pFVar2->x).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
      *(undefined8 *)&(pFVar2->x).super_Tuple3<pbrt::Vector3,_float>.z = 0;
      (pFVar2->y).super_Tuple3<pbrt::Vector3,_float>.y = 1.0;
      (pFVar2->y).super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
      (pFVar2->z).super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
      (pFVar2->z).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
      pSVar7[uVar11].vp.bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.z = 1.0;
      pNVar3 = &pSVar7[uVar11].vp.bsdf.ng;
      (pNVar3->super_Tuple3<pbrt::Normal3,_float>).x = 0.0;
      (pNVar3->super_Tuple3<pbrt::Normal3,_float>).y = 0.0;
      *(undefined8 *)&(pNVar3->super_Tuple3<pbrt::Normal3,_float>).z = 0;
      pSVar4 = &pSVar7[uVar11].vp.beta;
      (pSVar4->values).values[0] = 0.0;
      (pSVar4->values).values[1] = 0.0;
      (pSVar4->values).values[2] = 0.0;
      (pSVar4->values).values[3] = 0.0;
      lVar12 = 0;
      do {
        LOCK();
        *(undefined4 *)((long)(&(pSVar7->vp).beta + -7) + 8 + lVar12 + lVar10) = 0;
        UNLOCK();
        lVar12 = lVar12 + 4;
      } while (lVar12 != 0x10);
      pSVar7[uVar11].M = (__atomic_base<int>)0x0;
      pSVar7[uVar11].N = 0.0;
      pSVar7[uVar11].tau.r = 0.0;
      pSVar7[uVar11].tau.g = 0.0;
      pSVar7[uVar11].tau.b = 0.0;
      uVar11 = uVar11 + 1;
      lVar10 = lVar10 + 0xa0;
    } while (uVar11 != uVar13);
  }
  return;
}

Assistant:

Array2D(const Bounds2i &extent, allocator_type allocator = {})
        : extent(extent), allocator(allocator) {
        int n = extent.Area();
        values = allocator.allocate_object<T>(n);
        for (int i = 0; i < n; ++i)
            allocator.construct(values + i);
    }